

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::GeneratedMessageReflection::RepeatedFieldData
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,CppType cpp_type
          ,Descriptor *message_type)

{
  Descriptor *pDVar1;
  bool bVar2;
  CppType CVar3;
  int number;
  Type TVar4;
  LogMessage *pLVar5;
  Descriptor *pDVar6;
  ExtensionSet *this_00;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  Descriptor *local_38;
  Descriptor *message_type_local;
  FieldDescriptor *pFStack_28;
  CppType cpp_type_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_38 = message_type;
  message_type_local._4_4_ = cpp_type;
  pFStack_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar2 = FieldDescriptor::is_repeated(field);
  local_71 = 0;
  if (!bVar2) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x899);
    local_71 = 1;
    pLVar5 = LogMessage::operator<<(&local_70,"CHECK failed: field->is_repeated(): ");
    LogFinisher::operator=(local_85,pLVar5);
  }
  if ((local_71 & 1) != 0) {
    LogMessage::~LogMessage(&local_70);
  }
  CVar3 = FieldDescriptor::cpp_type(pFStack_28);
  local_c1 = 0;
  if ((CVar3 != message_type_local._4_4_) &&
     ((CVar3 = FieldDescriptor::cpp_type(pFStack_28), CVar3 != CPPTYPE_ENUM ||
      (message_type_local._4_4_ != CPPTYPE_INT32)))) {
    LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x89c);
    local_c1 = 1;
    pLVar5 = LogMessage::operator<<
                       (&local_c0,
                        "CHECK failed: field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32): "
                       );
    pLVar5 = LogMessage::operator<<
                       (pLVar5,"The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
    pLVar5 = LogMessage::operator<<
                       (pLVar5,"the actual field type (for enums T should be the generated enum ");
    pLVar5 = LogMessage::operator<<(pLVar5,"type or int32).");
    LogFinisher::operator=(&local_c2,pLVar5);
  }
  if ((local_c1 & 1) != 0) {
    LogMessage::~LogMessage(&local_c0);
  }
  pDVar1 = local_38;
  if (local_38 != (Descriptor *)0x0) {
    pDVar6 = FieldDescriptor::message_type(pFStack_28);
    local_101 = 0;
    if (pDVar1 != pDVar6) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x8a1);
      local_101 = 1;
      pLVar5 = LogMessage::operator<<
                         (&local_100,"CHECK failed: (message_type) == (field->message_type()): ");
      LogFinisher::operator=(&local_102,pLVar5);
    }
    if ((local_101 & 1) != 0) {
      LogMessage::~LogMessage(&local_100);
    }
  }
  bVar2 = FieldDescriptor::is_extension(pFStack_28);
  if (bVar2) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(pFStack_28);
    TVar4 = FieldDescriptor::type(pFStack_28);
    bVar2 = FieldDescriptor::is_packed(pFStack_28);
    this_local = (GeneratedMessageReflection *)
                 ExtensionSet::MutableRawRepeatedField
                           (this_00,number,(FieldType)TVar4,bVar2,pFStack_28);
  }
  else {
    this_local = (GeneratedMessageReflection *)
                 MutableRawNonOneof<char>(this,(Message *)field_local,pFStack_28);
  }
  return this_local;
}

Assistant:

void* GeneratedMessageReflection::RepeatedFieldData(
    Message* message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpp_type,
    const Descriptor* message_type) const {
  GOOGLE_CHECK(field->is_repeated());
  GOOGLE_CHECK(field->cpp_type() == cpp_type ||
        (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
         cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32).";
  if (message_type != NULL) {
    GOOGLE_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}